

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cc
# Opt level: O0

ts_nsec timed_fdb_iterator_get(fdb_iterator *it,fdb_doc **doc)

{
  fdb_status fVar1;
  ts_nsec start_00;
  ts_nsec end_00;
  fdb_status status;
  ts_nsec end;
  ts_nsec start;
  fdb_doc **in_stack_00000040;
  fdb_iterator *in_stack_00000048;
  undefined8 local_8;
  
  start_00 = get_monotonic_ts();
  fVar1 = fdb_iterator_get(in_stack_00000048,in_stack_00000040);
  end_00 = get_monotonic_ts();
  if (fVar1 == FDB_RESULT_SUCCESS) {
    local_8 = ts_diff(start_00,end_00);
  }
  else {
    local_8 = 0xffffffff;
  }
  return local_8;
}

Assistant:

ts_nsec timed_fdb_iterator_get(fdb_iterator *it, fdb_doc **doc){

    ts_nsec start, end;
    fdb_status status;

    start = get_monotonic_ts();
    status = fdb_iterator_get(it, doc);
    end = get_monotonic_ts();

    if(status == FDB_RESULT_SUCCESS){
      return ts_diff(start, end);
    } else {
      return ERR_NS;
    }

}